

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus
DecodeFGR64RegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus DVar1;
  MCRegisterClass *pMVar2;
  
  DVar1 = MCDisassembler_Fail;
  if (RegNo < 0x20) {
    pMVar2 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,0x1b);
    MCOperand_CreateReg0(Inst,(uint)pMVar2->RegsBegin[RegNo]);
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeFGR64RegisterClass(MCInst *Inst,
		unsigned RegNo, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Reg;

	if (RegNo > 31)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, Mips_FGR64RegClassID, RegNo);
	MCOperand_CreateReg0(Inst, Reg);
	return MCDisassembler_Success;
}